

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

void gf128_mul_uint64(uint64_t *result,uint64_t *arg1,uint64_t *arg2)

{
  uint64_t Z1;
  uint64_t Z0;
  uint64_t X1;
  uint64_t X0;
  uint64_t t;
  int i;
  uint64_t *arg2_local;
  uint64_t *arg1_local;
  uint64_t *result_local;
  
  Z0 = 0;
  Z1 = 0;
  X0 = arg1[1] >> 0x38 | (arg1[1] & 0xff000000000000) >> 0x28 | (arg1[1] & 0xff0000000000) >> 0x18 |
       (arg1[1] & 0xff00000000) >> 8 | (arg1[1] & 0xff000000) << 8 | (arg1[1] & 0xff0000) << 0x18 |
       (arg1[1] & 0xff00) << 0x28 | arg1[1] << 0x38;
  X1 = *arg1 >> 0x38 | (*arg1 & 0xff000000000000) >> 0x28 | (*arg1 & 0xff0000000000) >> 0x18 |
       (*arg1 & 0xff00000000) >> 8 | (*arg1 & 0xff000000) << 8 | (*arg1 & 0xff0000) << 0x18 |
       (*arg1 & 0xff00) << 0x28 | *arg1 << 0x38;
  t = arg2[1] >> 0x38 | (arg2[1] & 0xff000000000000) >> 0x28 | (arg2[1] & 0xff0000000000) >> 0x18 |
      (arg2[1] & 0xff00000000) >> 8 | (arg2[1] & 0xff000000) << 8 | (arg2[1] & 0xff0000) << 0x18 |
      (arg2[1] & 0xff00) << 0x28 | arg2[1] << 0x38;
  for (i = 0; i < 0x40; i = i + 1) {
    if ((t & 1) != 0) {
      Z0 = X0 ^ Z0;
      Z1 = X1 ^ Z1;
    }
    t = t >> 1;
    if ((X1 & 0x8000000000000000) == 0) {
      X1 = X0 >> 0x3f ^ X1 << 1;
      X0 = X0 << 1;
    }
    else {
      X1 = X0 >> 0x3f ^ X1 << 1;
      X0 = X0 << 1 ^ 0x87;
    }
  }
  t = *arg2 >> 0x38 | (*arg2 & 0xff000000000000) >> 0x28 | (*arg2 & 0xff0000000000) >> 0x18 |
      (*arg2 & 0xff00000000) >> 8 | (*arg2 & 0xff000000) << 8 | (*arg2 & 0xff0000) << 0x18 |
      (*arg2 & 0xff00) << 0x28 | *arg2 << 0x38;
  for (i = 0; i < 0x3f; i = i + 1) {
    if ((t & 1) != 0) {
      Z0 = X0 ^ Z0;
      Z1 = X1 ^ Z1;
    }
    t = t >> 1;
    if ((X1 & 0x8000000000000000) == 0) {
      X1 = X0 >> 0x3f ^ X1 << 1;
      X0 = X0 << 1;
    }
    else {
      X1 = X0 >> 0x3f ^ X1 << 1;
      X0 = X0 << 1 ^ 0x87;
    }
  }
  if ((t & 1) != 0) {
    Z0 = X0 ^ Z0;
    Z1 = X1 ^ Z1;
  }
  *result = Z1 >> 0x38 | (Z1 & 0xff000000000000) >> 0x28 | (Z1 & 0xff0000000000) >> 0x18 |
            (Z1 & 0xff00000000) >> 8 | (Z1 & 0xff000000) << 8 | (Z1 & 0xff0000) << 0x18 |
            (Z1 & 0xff00) << 0x28 | Z1 << 0x38;
  result[1] = Z0 >> 0x38 | (Z0 & 0xff000000000000) >> 0x28 | (Z0 & 0xff0000000000) >> 0x18 |
              (Z0 & 0xff00000000) >> 8 | (Z0 & 0xff000000) << 8 | (Z0 & 0xff0000) << 0x18 |
              (Z0 & 0xff00) << 0x28 | Z0 << 0x38;
  return;
}

Assistant:

static void gf128_mul_uint64 (uint64_t *result, uint64_t *arg1, uint64_t *arg2)
{
	int i = 0;
	register uint64_t t, X0, X1;
	uint64_t Z0 = 0, Z1 = 0;

#ifdef L_ENDIAN
	X0 = BSWAP64(*(arg1 + 1));
	X1 = BSWAP64(*arg1);
#else
	X0 = *(arg1 + 1);
	X1 = *arg1;
#endif

	//first 64 bits of arg1
#ifdef L_ENDIAN
	t = BSWAP64(*(arg2 + 1));
#else
	t = *(arg2 + 1);
#endif

	for (i = 0; i < 64; i++) {
		if (t & 0x1) {
			Z0 ^= X0;
			Z1 ^= X1;
		}
		t >>= 1;
		if (X1 & 0x8000000000000000) {
			X1 <<= 1;
			X1 ^= X0>>63;
			X0 <<= 1;
			X0 ^= 0x87;
		}
		else {
			X1 <<= 1;
			X1 ^= X0>>63;
			X0 <<= 1;
		}
	}

	//second 64 bits of arg2
#ifdef L_ENDIAN
	t = BSWAP64(*arg2);
#else
	t = *arg2;
#endif

	for (i = 0; i < 63; i++) {
		if (t & 0x1) {
			Z0 ^= X0;
			Z1 ^= X1;
		}
		t >>= 1;
		if (X1 & 0x8000000000000000) {
			X1 <<= 1;
			X1 ^= X0>>63;
			X0 <<= 1;
			X0 ^= 0x87;
		}
		else {
			X1 <<= 1;
			X1 ^= X0>>63;
			X0 <<= 1;
		}
	}

	if (t & 0x1) {
		Z0 ^= X0;
		Z1 ^= X1;
	}

#ifdef L_ENDIAN
	result[0] = BSWAP64(Z1);
	result[1] = BSWAP64(Z0);
#else
	result[0] = Z1;
	result[1] = Z0;
#endif
}